

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_extend_scanned_scalar(Parser *this,csubstr s)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  pfn_error p_Var4;
  code *pcVar5;
  Location LVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  size_t indentation;
  csubstr cVar10;
  substr s_00;
  ro_substr chars;
  ro_substr chars_00;
  csubstr currscalar;
  csubstr local_b0;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  csubstr cStack_88;
  substr full;
  substr local_40;
  
  uVar1 = this->m_state->flags;
  local_b0 = s;
  if ((~uVar1 & 100) == 0) {
    if ((uVar1 & 0x10) == 0) {
      indentation = this->m_state->scalar_col;
    }
    else {
      indentation = 0;
    }
    cVar10 = _scan_to_next_nonempty_line(this,indentation);
    if (cVar10.str == (char *)0x0 || cVar10.len == 0) {
      return local_b0;
    }
    local_40 = _scan_complex_key(this,s,cVar10);
    chars_00.len = 4;
    chars_00.str = " \t\r\n";
    s_00 = basic_substring<char>::trimr(&local_40,chars_00);
    full = s_00;
    iVar8 = basic_substring<char>::compare(&full,s.str,s.len);
    if (iVar8 == 0) {
      return local_b0;
    }
  }
  else {
    chars.len = 1;
    chars.str = "*";
    bVar7 = basic_substring<const_char>::begins_with_any(&local_b0,chars);
    if (bVar7) {
      return local_b0;
    }
    uVar1 = this->m_state->flags;
    if ((uVar1 & 0x10) == 0) {
      sVar2 = this->m_state->indref;
      indentation = sVar2;
      if (sVar2 != 0) {
        indentation = sVar2 + 1;
      }
      if ((uVar1 & 2) == 0) {
        indentation = sVar2 + 1;
      }
      cVar10 = _scan_to_next_nonempty_line(this,indentation);
      pcVar9 = cVar10.str;
      if (pcVar9 == (char *)0x0 || cVar10.len == 0) {
        return local_b0;
      }
      sVar2 = (this->m_state->line_contents).full.len;
      if ((sVar2 == 0) ||
         (pcVar3 = (this->m_state->line_contents).full.str,
         pcVar9 < pcVar3 || pcVar3 + sVar2 < pcVar9 + cVar10.len)) {
        full.len._0_1_ = 'i';
        full.len._1_1_ = 'l';
        full.len._2_1_ = 'e';
        full.len._3_1_ = 'd';
        full.len._4_1_ = ':';
        full.len._5_1_ = ' ';
        full.len._6_1_ = '(';
        full.len._7_1_ = 'm';
        full.str = (char *)0x6166206b63656863;
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar5 = (code *)swi(3);
          cVar10 = (csubstr)(*pcVar5)();
          return cVar10;
        }
        p_Var4 = (this->m_stack).m_callbacks.m_error;
        local_a0 = 0;
        uStack_98 = 0x7531;
        local_90 = 0;
        cStack_88 = to_csubstr(
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                              );
        LVar6.super_LineCol.line = uStack_98;
        LVar6.super_LineCol.offset = local_a0;
        LVar6.super_LineCol.col = local_90;
        LVar6.name.str = cStack_88.str;
        LVar6.name.len = cStack_88.len;
        (*p_Var4)((char *)&full,0x38,LVar6,(this->m_stack).m_callbacks.m_user_data);
      }
      s_00 = _scan_plain_scalar_blck(this,local_b0,cVar10,indentation);
      if (s_00.len < local_b0.len) {
        return local_b0;
      }
    }
    else {
      cVar10 = _scan_to_next_nonempty_line(this,0);
      currscalar.len = cVar10.len;
      if (cVar10.str == (char *)0x0 || currscalar.len == 0) {
        return local_b0;
      }
      currscalar.str = local_b0.str;
      s_00 = _scan_plain_scalar_flow(this,currscalar,cVar10);
      indentation = 0;
    }
  }
  cVar10 = _filter_plain_scalar(this,s_00,indentation);
  return cVar10;
}

Assistant:

csubstr Parser::_extend_scanned_scalar(csubstr s)
{
    if(has_all(RMAP|RKEY|QMRK))
    {
        size_t scalar_indentation = has_any(FLOW) ? 0 : m_state->scalar_col;
        _c4dbgpf("extend_scalar: explicit key! indref={} scalar_indentation={} scalar_col={}", m_state->indref, scalar_indentation, m_state->scalar_col);
        csubstr n = _scan_to_next_nonempty_line(scalar_indentation);
        if(!n.empty())
        {
            substr full = _scan_complex_key(s, n).trimr(" \t\r\n");
            if(full != s)
                s = _filter_plain_scalar(full, scalar_indentation);
        }
    }
    // deal with plain (unquoted) scalars that continue to the next line
    else if(!s.begins_with_any("*")) // cannot be a plain scalar if it starts with * (that's an anchor reference)
    {
        _c4dbgpf("extend_scalar: line ended, scalar='{}'", s);
        if(has_none(FLOW))
        {
            size_t scalar_indentation = m_state->indref + 1;
            if(has_all(RUNK) && scalar_indentation == 1)
                scalar_indentation = 0;
            csubstr n = _scan_to_next_nonempty_line(scalar_indentation);
            if(!n.empty())
            {
                _c4dbgpf("rscalar[IMPL]: state_indref={} state_indentation={} scalar_indentation={}", m_state->indref, m_state->line_contents.indentation, scalar_indentation);
                _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.full.is_super(n));
                substr full = _scan_plain_scalar_blck(s, n, scalar_indentation);
                if(full.len >= s.len)
                    s = _filter_plain_scalar(full, scalar_indentation);
            }
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            csubstr n = _scan_to_next_nonempty_line(/*indentation*/0);
            if(!n.empty())
            {
                _c4dbgp("rscalar[FLOW]");
                substr full = _scan_plain_scalar_flow(s, n);
                s = _filter_plain_scalar(full, /*indentation*/0);
            }
        }
    }

    return s;
}